

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void insert<32768u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
               (TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root,uchar **strings
               ,size_t n)

{
  bool bVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *this;
  vector_block<unsigned_char_*,_128U> *this_00;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *pTVar3;
  size_t depth;
  size_t sVar4;
  BurstSimple<unsigned_short> local_49;
  uchar *str;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *local_40;
  uchar **local_38;
  
  sVar4 = 0;
  local_40 = root;
  local_38 = strings;
  do {
    if (sVar4 == n) {
      return;
    }
    str = local_38[sVar4];
    uVar2 = get_char<unsigned_short>(str,0);
    depth = 2;
    this = local_40;
    while( true ) {
      bVar1 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::is_trie
                        (this,(uint)uVar2);
      if (!bVar1) break;
      if ((char)uVar2 == '\0') {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      this = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_node
                       (this,(uint)uVar2);
      uVar2 = get_char<unsigned_short>(str,depth);
      depth = depth + 2;
    }
    this_00 = TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                        (this,(uint)uVar2);
    if (this_00 == (vector_block<unsigned_char_*,_128U> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 32768U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                   );
    }
    vector_block<unsigned_char_*,_128U>::push_back(this_00,&str);
    if (((char)uVar2 != '\0') &&
       (0x8000 < ((long)(this_00->_index_block).
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start) * 0x10 -
                 (ulong)this_00->_left_in_block)) {
      pTVar3 = BurstSimple<unsigned_short>::operator()(&local_49,this_00,depth);
      (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = pTVar3;
      make_trie((this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + uVar2);
      vector_block<unsigned_char_*,_128U>::~vector_block(this_00);
      operator_delete(this_00);
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}